

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

void http_entity_reset(nni_http_entity *entity)

{
  nni_http_entity *entity_local;
  
  if (((entity->own & 1U) != 0) && (entity->size != 0)) {
    nni_free(entity->data,entity->size);
  }
  http_headers_reset(&entity->hdrs);
  nni_free(entity->buf,entity->bufsz);
  entity->data = (char *)0x0;
  entity->size = 0;
  entity->own = false;
  entity->parsed = false;
  entity->buf = (char *)0x0;
  entity->bufsz = 0;
  return;
}

Assistant:

static void
http_entity_reset(nni_http_entity *entity)
{
	if (entity->own && entity->size) {
		nni_free(entity->data, entity->size);
	}
	http_headers_reset(&entity->hdrs);
	nni_free(entity->buf, entity->bufsz);
	entity->data   = NULL;
	entity->size   = 0;
	entity->own    = false;
	entity->parsed = false;
	entity->buf    = NULL;
	entity->bufsz  = 0;
}